

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

filemgr_dirty_update_node * filemgr_dirty_update_get_latest(filemgr *file)

{
  long in_RDI;
  filemgr_dirty_update_node *node;
  memory_order in_stack_ffffffffffffffec;
  filemgr_dirty_update_node *atomic_val;
  
  pthread_spin_lock((pthread_spinlock_t *)(in_RDI + 0x2d0));
  atomic_val = *(filemgr_dirty_update_node **)(in_RDI + 0x2c8);
  if (atomic_val != (filemgr_dirty_update_node *)0x0) {
    atomic_incr_uint32_t((atomic<unsigned_int> *)atomic_val,in_stack_ffffffffffffffec);
  }
  pthread_spin_unlock((pthread_spinlock_t *)(in_RDI + 0x2d0));
  return atomic_val;
}

Assistant:

struct filemgr_dirty_update_node *filemgr_dirty_update_get_latest(struct filemgr *file)
{
    struct filemgr_dirty_update_node *node = NULL;

    // find the first immutable node from the end
    spin_lock(&file->dirty_update_lock);

    node = file->latest_dirty_update;
    if (node) {
        atomic_incr_uint32_t(&node->ref_count);
    }

    spin_unlock(&file->dirty_update_lock);
    return node;
}